

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Meter *pMVar1;
  Meter *pMVar2;
  QSlider *pQVar3;
  Object local_198 [12];
  QFlags<Qt::AlignmentFlag> local_18c;
  QSlider *local_188;
  QSlider *s;
  QColor local_178;
  QColor local_168;
  QColor local_158;
  QArrayDataPointer<char16_t> local_148;
  QString local_130;
  QArrayDataPointer<char16_t> local_118;
  QString local_100;
  QColor local_e8;
  QColor local_d8;
  QColor local_c8;
  QColor local_b8;
  Meter *local_a8;
  Meter *m;
  QVBoxLayout *l;
  QFlags<Qt::WindowType> local_84;
  QWidget local_80 [8];
  QWidget w;
  QApplication local_58 [8];
  QApplication app;
  char **argv_local;
  int argc_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_10;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QApplication::QApplication(local_58,(int *)&argv_local,argv,0x60204);
  QFlags<Qt::WindowType>::QFlags(&local_84);
  QWidget::QWidget(local_80,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_84.i);
  pMVar2 = (Meter *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pMVar2,local_80);
  m = pMVar2;
  pMVar2 = (Meter *)operator_new(0x30);
  Meter::Meter(pMVar2,local_80);
  local_a8 = pMVar2;
  Meter::setMinValue(pMVar2,0.0);
  Meter::setMaxValue(local_a8,220.0);
  Meter::setValue(local_a8,90.0);
  pMVar2 = local_a8;
  QColor::QColor(&local_b8,black);
  Meter::setBackgroundColor(pMVar2,&local_b8);
  pMVar2 = local_a8;
  QColor::QColor(&local_c8,blue);
  Meter::setNeedleColor(pMVar2,&local_c8);
  pMVar2 = local_a8;
  QColor::QColor(&local_d8,white);
  Meter::setTextColor(pMVar2,&local_d8);
  pMVar2 = local_a8;
  QColor::QColor(&local_e8,white);
  Meter::setGridColor(pMVar2,&local_e8);
  pMVar2 = local_a8;
  local_28 = &local_118;
  str = L"speed";
  _argc_local = L"speed";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_118,(Data *)0x0,L"speed",5);
  QString::QString(&local_100,&local_118);
  Meter::setLabel(pMVar2,&local_100);
  QString::~QString(&local_100);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  pMVar2 = local_a8;
  local_10 = &local_148;
  str_1 = L"km/h";
  local_20 = L"km/h";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_148,(Data *)0x0,L"km/h",4);
  QString::QString(&local_130,&local_148);
  Meter::setUnitsLabel(pMVar2,&local_130);
  QString::~QString(&local_130);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  Meter::setRadius(local_a8,200);
  Meter::setStartScaleAngle(local_a8,0x23);
  Meter::setStopScaleAngle(local_a8,0x145);
  Meter::setScaleStep(local_a8,2.0);
  Meter::setScaleGridStep(local_a8,10.0);
  Meter::setDrawValue(local_a8,true);
  Meter::setDrawGridValues(local_a8,true);
  Meter::setDrawValuePrecision(local_a8,0);
  Meter::setScaleLabelPrecision(local_a8,0);
  pMVar2 = local_a8;
  QColor::QColor(&local_158,transparent);
  Meter::setThresholdRange(pMVar2,0.0,110.0,0,&local_158);
  pMVar2 = local_a8;
  QColor::QColor(&local_168,yellow);
  Meter::setThresholdRange(pMVar2,110.0,130.0,1,&local_168);
  pMVar2 = local_a8;
  QColor::QColor(&local_178,red);
  Meter::setThresholdRange(pMVar2,130.0,220.1,2,&local_178);
  pMVar1 = m;
  pMVar2 = local_a8;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&s + 4));
  QBoxLayout::addWidget(&pMVar1->super_QWidget,(int)pMVar2,(QFlags_conflict *)0x0);
  pQVar3 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar3,Horizontal,local_80);
  local_188 = pQVar3;
  QAbstractSlider::setMinimum((int)pQVar3);
  QAbstractSlider::setMaximum((int)local_188);
  QAbstractSlider::setValue((int)local_188);
  pMVar2 = m;
  pQVar3 = local_188;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_18c);
  QBoxLayout::addWidget(&pMVar2->super_QWidget,(int)pQVar3,(QFlags_conflict *)0x0);
  QObject::connect<void(QAbstractSlider::*)(int),void(Meter::*)(double)>
            (local_198,(offset_in_QAbstractSlider_to_subr)local_188,
             (Object *)QAbstractSlider::valueChanged,0,(ConnectionType)local_a8);
  QMetaObject::Connection::~Connection((Connection *)local_198);
  QWidget::show();
  argv_local._4_4_ = QApplication::exec();
  QWidget::~QWidget(local_80);
  QApplication::~QApplication(local_58);
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char ** argv )
{
	QApplication app( argc, argv );

	QWidget w;

	auto * l = new QVBoxLayout( &w );

	auto * m = new Meter( &w );

	m->setMinValue( 0.0 );
	m->setMaxValue( 220.0 );
	m->setValue( 90.0 );
	m->setBackgroundColor( Qt::black );
	m->setNeedleColor( Qt::blue );
	m->setTextColor( Qt::white );
	m->setGridColor( Qt::white );
	m->setLabel( QStringLiteral( "speed" ) );
	m->setUnitsLabel( QStringLiteral( "km/h" ) );
	m->setRadius( 200 );
	m->setStartScaleAngle( 35 );
	m->setStopScaleAngle( 325 );
	m->setScaleStep( 2.0 );
	m->setScaleGridStep( 10.0 );
	m->setDrawValue( true );
	m->setDrawGridValues( true );
	m->setDrawValuePrecision( 0 );
	m->setScaleLabelPrecision( 0 );
	m->setThresholdRange( 0, 110.0, 0 );
	m->setThresholdRange( 110.0, 130.0, 1, Qt::yellow );
	m->setThresholdRange( 130.0, 220.1, 2, Qt::red );

	l->addWidget( m );

	auto * s = new QSlider( Qt::Horizontal, &w );
	s->setMinimum( 0 );
	s->setMaximum( 220 );
	s->setValue( 90 );

	l->addWidget( s );

	QObject::connect( s, &QSlider::valueChanged, m, &Meter::setValue );

	w.show();

	return QApplication::exec();
}